

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symtab.c
# Opt level: O0

int LineParts(void)

{
  int iVar1;
  SkipEnt *pSVar2;
  InFCtl *pIVar3;
  bool bVar4;
  int local_24;
  char *x;
  int local_10;
  int eofflag;
  int i;
  
  while( true ) {
    while( true ) {
      DestOp[0] = '\0';
      SrcOp[0] = '\0';
      OpCode[0] = '\0';
      Label[0] = '\0';
      Line[0] = '\0';
      DestLoc = 0;
      SrcLoc = 0;
      OpLoc = 0;
      LabLoc = 0;
      Dest.Mode = 0;
      Src.Mode = 0;
      nX = 0;
      nD = 0;
      nS = 0;
      nO = 0;
      InstSize = 0;
      AddrAdv = 0;
      ErrLim = 0;
      FwdShort = 0;
      PrntAddr = 0;
      DupFact = 1;
      if ((LineCount == 0) && (HeaderFN[0] != '\0')) {
        strcpy(Line,"        INCLUDE ");
        strcat(Line,HeaderFN);
        strcat(Line,"        ;Generated for header file");
        strcpy(OpCode,"INCLUDE");
        OpLoc = 8;
        strcpy(SrcOp,HeaderFN);
        LineCount = LineCount + 1;
        SrcLoc = 0x10;
        return 0;
      }
      if (InF->UPtr == (char *)0x0) {
        x._4_4_ = GetLine();
      }
      else {
        GetMacLine();
        x._4_4_ = 0;
      }
      if (((Line[0] != '\0') && (Line[0] != '*')) && (Line[0] != ';')) {
        SubArgs();
        GetParts();
      }
      local_10 = x._4_4_;
      if (x._4_4_ == 0) {
        if ((InF->NArg != -1) && (Dir != 0x1c)) {
          iVar1 = strcmp(OpCode,"ENDM");
          if (iVar1 == 0) {
            local_10 = 1;
            InF->Line = InF->Line + 1;
            if (SkipNest != 0) {
              Error(OpLoc,0x13);
              WriteListLine(&List);
              SkipNest = 0;
            }
          }
          else if ((SkipNest == 0) && (iVar1 = strcmp(OpCode,"MEXIT"), iVar1 == 0)) {
            local_10 = 1;
            InF->Line = InF->Line + 1;
          }
        }
      }
      else if (SkipNest != 0) {
        Error(OpLoc,0x13);
        WriteListLine(&List);
        SkipNest = 0;
      }
      if (local_10 != 0) break;
      if ((PrevDir == 0x2a) && (iVar1 = strcmp(OpCode,"MACRO"), iVar1 == 0)) {
        InF->Line = InF->Line + 1;
      }
      else {
        if (SkipNest == 0) goto LAB_0010f6ad;
        InF->Line = InF->Line + 1;
        iVar1 = CountNest(OpCode);
        SkipNest = iVar1 + SkipNest;
      }
    }
    if (((Pass2 == 0) && (IncStart != 0)) && (IncPtr == InF)) {
      SkipLim->Start = IncStart;
      SkipLim->Finish = LineCount;
      SkipLim->MCount = MacCount;
      if ((SkipLim->Set1 != (SetFixup *)0x0) &&
         (pSVar2 = (SkipEnt *)(SetFixLim + -1), SkipLim + 1 <= pSVar2)) {
        SetFixLim = (SetFixup *)pSVar2;
        pSVar2->Set1 = (SetFixup *)0x0;
        SetFixLim->Val = 0;
        SetFixLim->Hunk = 0;
      }
      SkipLim = SkipLim + 1;
      IncStart = 0;
    }
    if (InFNum == 0) break;
    bVar4 = InF->UPtr == (char *)0x0;
    if (bVar4) {
      if (Quiet < 0) {
        fprintf(_stderr,"%d\n",(ulong)(uint)InF->Line);
      }
      close(In.fd);
      In.fd = 0;
    }
    NextFNS = InF->NPtr;
    InFNum = InFNum + -1;
    pIVar3 = InF + 1;
    if (InFNum < OuterMac) {
      OuterMac = 0;
    }
    if (InF[1].UPtr == (char *)0x0) {
      if (bVar4) {
        InF = pIVar3;
        ShowFile(0);
      }
      else {
        InF = pIVar3;
        if (InnrFMac != 0) {
          ShowFile(0);
          InnrFMac = 0;
        }
      }
      if (In.fd == 0) {
        In.fd = open(InF->NPtr,0);
        lseek(In.fd,InF->Pos,0);
        In.Lim = In.Buf;
        In.Ptr = In.Buf;
      }
    }
    else {
      InF = pIVar3;
      if (bVar4) {
        InnrFMac = 1;
      }
    }
  }
LAB_0010f6ad:
  LineCount = LineCount + 1;
  InF->Line = InF->Line + 1;
  if (((Label[0] != '\0') && (Label[0] != '\\')) && ((Label[0] < '0' || ('9' < Label[0])))) {
    LabLine = LineCount;
  }
  if (Quiet != 0) {
    if (Quiet < 0) {
      local_24 = InF->Line;
    }
    else {
      local_24 = LineCount;
    }
    if (local_24 % Quiet == 0) {
      ShowLine(local_24);
    }
  }
  if (LineCount == DebugStart) {
    fprintf(_stderr,"%d\n",(ulong)(uint)LineCount);
  }
  if ((DebugStart <= LineCount) && (LineCount <= DebugEnd)) {
    printf("%9lx %5d %s\n",AddrCnt,(ulong)(uint)LineCount,Line);
  }
  return x._4_4_;
}

Assistant:

int LineParts(void)
/* Gets the next statement and extracts its component parts.
 If end of file is reached, and we're in a macro or include
 file, the file is closed and the next outermost file is
 continued.  If we have reached the end of the source file, or
 encounter an ENDM or MEXIT directive within a macro expansion,
 the current input file is closed and TRUE is returned.

 If we're in a user macro (indicated by UPtr being nonzero),
 we'll get the next statement from the save area in memory instead.

 Macro arguments, if any, are substituted.

 LineCount is incremented if a statement was successfully read.

 If this is the first call of this routine (i.e. LineCount is zero)
 and HeaderFN is not a null string, we'll return an INCLUDE statement
 requesting the specified header file, rather than reading the first
 statement from the source file.

 The following fields are set up:
 Line - statement line image
 Label        - instruction label (without trailing colon)
 OpCode       - instruction mnemonic (converted to upper case)
 SrcOp        - first (source) operand
 DestOp       - second (destination) operand
 Size - size from OpCode
 LabLoc       - displacement to start of instruction label
 OpLoc        - displacement to start of instruction mnemonic
 SrcLoc       - displacement to start of source operand
 DestLoc      - displacement to start of destination operand
 InFNum       - decremented if end of file is reached
 InF  - incremented if end of file is reached
 LabLine      - set to LineCount if this line is labeled
 (unless it's a local label)
 */
{
	register int i;
	int eofflag;
	char *x;

	while (1) { /* Repeat until we get something (not end of INCLUDE). */
		Line[0] = Label[0] = OpCode[0] = SrcOp[0] = DestOp[0] = '\0';
		LabLoc = OpLoc = SrcLoc = DestLoc = 0;
		Src.Mode = Dest.Mode = 0;
		ErrLim = AddrAdv = InstSize = nO = nS = nD = nX = 0;
		PrntAddr = FwdShort = FALSE;
		DupFact = 1;

		if ((LineCount == 0) && (HeaderFN[0])) { /* Header file */
			strcpy(Line, "        INCLUDE "); /* Make an INCLUDE stmt. */
			strcat(Line, HeaderFN);
			strcat(Line, "        ;Generated for header file");
			strcpy(OpCode, "INCLUDE"); /* Dummy op code */
			OpLoc = 8;
			strcpy(SrcOp, HeaderFN); /* Dummy source operand */
			SrcLoc = 16;
			LineCount++;
			return (FALSE);
		}

		if (InF->UPtr != 0) { /* User macro input */
			GetMacLine();
			eofflag = FALSE;
		} else { /* Normal file input */
			eofflag = GetLine();
		}
		if ((Line[0] != '\0') && (Line[0] != '*') && (Line[0] != ';')) {
			SubArgs(); /* Substitute macro arguments. */
			GetParts(); /* Break Line into its component parts. */
		}

		/* ------ If we have reached the end of a macro or ------ */
		/* ------ include file, return to the calling file. ----- */

		i = eofflag; /* End of file */

		if (i) {
			if (SkipNest != 0) {
				Error(OpLoc, NoENDC); /* ENDC is missing! */
				WriteListLine(&List); /* It's not normally listed. */
				SkipNest = 0;
			}
		} else if ((InF->NArg != -1) && (Dir != Macro)) { /* Macro exits */
			if (strcmp(OpCode, "ENDM") == 0) {
				i = TRUE;
				(InF->Line)++; /* Count ENDM directive. */
				if (SkipNest != 0) {
					Error(OpLoc, NoENDC); /* ENDC is missing! */
					WriteListLine(&List); /* It's not normally listed. */
					SkipNest = 0;
				}
			} else if (SkipNest == 0) {
				if (strcmp(OpCode, "MEXIT") == 0) {
					i = TRUE;
					(InF->Line)++; /* Count MEXIT directive. */
				}
			}
		}
		if (!i) { /* Not end of file or macro */
			if (PrevDir == MacCall) {
				if (strcmp(OpCode, "MACRO") == 0) {
					(InF->Line)++; /* Count macro header */
					continue; /*  and ignore it.    */
				}
			}
			if (SkipNest == 0) { /* If we're not skipping, */
				break; /*  we got something.     */
			} else {
				(InF->Line)++; /* Count skipped lines. */
				SkipNest += CountNest(OpCode); /* Adjust SkipNest. */
				continue;
			}
		}
		if (!Pass2 && (IncStart != 0) && (IncPtr == InF)) {
			SkipLim->Start = IncStart; /* End of skippable INCLUDE */
			SkipLim->Finish = LineCount; /* Save line numbers for pass 2. */
			SkipLim->MCount = MacCount; /* Save macro counter too. */
			if (SkipLim->Set1 != NULL) {
				SetFixLim--;
				x = (char *) SkipLim + sizeof(struct SkipEnt);
				if (x > (char *) SetFixLim) {
					SetFixLim++; /* No room for final entry */
				} else {
					SetFixLim->Sym = NULL; /* Null entry        */
					SetFixLim->Val = 0; /*  indicates end of */
					SetFixLim->Hunk = 0; /*  SET symbol list. */
				}
			}
			SkipLim++;
			IncStart = 0;
		}
		if (InFNum == 0)
			break; /* End of source file */
		if ((i = (InF->UPtr == 0))) {
			if (Quiet < 0)
				fprintf(stderr, "%d\n", InF->Line);
#ifdef USEAMIGAOS
			Close(In.fd);
#else
			close (In.fd); /* Close inner file. */
#endif
			In.fd = 0;
		}
		NextFNS = InF->NPtr; /* Release space on name stack. */
		InFNum--; /* Return to outer file. */
		InF++;
		if (InFNum < OuterMac)
			OuterMac = 0; /* End of outer macro */
		if (InF->UPtr == 0) {
			if (i)
				ShowFile(FALSE); /* Inner file -> outer file */
			else if (InnrFMac) {
				ShowFile(FALSE); /* Inner user macro -> file */
				InnrFMac = FALSE;
			}
			if (In.fd == 0) {
#ifdef USEAMIGAOS
				In.fd = Open(InF->NPtr, MODE_OLDFILE);
				Seek(In.fd, InF->Pos, OFFSET_BEGINING);
#else
				In.fd = open (InF->NPtr, 0);
				lseek (In.fd, InF->Pos, 0);
#endif
				In.Ptr = In.Lim = In.Buf;
			}
		} else if (i) {
			InnrFMac = TRUE; /* Inner file -> outer user macro */
		}
	}
	LineCount++; /* Bump line counter. */
	(InF->Line)++;
	if ((Label[0] != '\0') && (Label[0] != '\\'))
		if ((Label[0] < '0') || (Label[0] > '9'))
			LabLine = LineCount; /* Save line number of label. */
	if (Quiet != 0) {
		i = (Quiet < 0 ? InF->Line : LineCount);
		if ((i % Quiet) == 0) { /* Display progress. */
			ShowLine(i);
		}
	}

	if (LineCount == DebugStart)
		fprintf(stderr, "%d\n", LineCount);
	if ((LineCount >= DebugStart) && (LineCount <= DebugEnd))
		printf("%9lx %5d %s\n", AddrCnt, LineCount, Line);

	return (eofflag);
}